

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O1

void __thiscall
duckdb::ReservoirQuantileState<duckdb::hugeint_t>::Resize
          (ReservoirQuantileState<duckdb::hugeint_t> *this,idx_t new_len)

{
  hugeint_t *__ptr;
  hugeint_t *phVar1;
  InternalException *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (this->len < new_len) {
    __ptr = this->v;
    phVar1 = (hugeint_t *)realloc(__ptr,new_len << 4);
    this->v = phVar1;
    if (phVar1 == (hugeint_t *)0x0) {
      free(__ptr);
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,"Memory allocation failure","");
      duckdb::InternalException::InternalException(this_00,(string *)local_40);
      __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    this->len = new_len;
  }
  return;
}

Assistant:

void Resize(idx_t new_len) {
		if (new_len <= len) {
			return;
		}
		T *old_v = v;
		v = (T *)realloc(v, new_len * sizeof(T));
		if (!v) {
			free(old_v);
			throw InternalException("Memory allocation failure");
		}
		len = new_len;
	}